

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentArithmeticWorkloadCullCase::genOccludedGeometry
          (ObjectData *__return_storage_ptr__,FragmentArithmeticWorkloadCullCase *this)

{
  _Vector_base<float,_std::allocator<float>_> local_f0;
  ProgramSources local_d8;
  
  Utils::getArithmeticWorkloadShader();
  Utils::getFullscreenQuad((vector<float,_std::allocator<float>_> *)&local_f0,0.8);
  ObjectData::ObjectData(__return_storage_ptr__,&local_d8,(Geometry *)&local_f0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  glu::ProgramSources::~ProgramSources(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccludedGeometry					(void) const
	{
		return ObjectData(Utils::getArithmeticWorkloadShader(), Utils::getFullscreenQuad(0.8f));
	}